

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_stream.hpp
# Opt level: O0

void __thiscall
libtorrent::http_stream::
async_connect<std::_Bind<void(libtorrent::ssl_stream<libtorrent::http_stream>::*(libtorrent::ssl_stream<libtorrent::http_stream>*,std::_Placeholder<1>,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>))(boost::system::error_code_const&,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>)>>
          (http_stream *this,endpoint_type *endpoint,
          _Bind<void_(libtorrent::ssl_stream<libtorrent::http_stream>::*(libtorrent::ssl_stream<libtorrent::http_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>))(const_boost::system::error_code_&,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>)>
          *handler)

{
  pointer __s;
  function<void_(const_boost::system::error_code_&)> local_148;
  http_stream *local_128;
  code *local_120;
  undefined8 local_118;
  type local_110;
  allocator<char> local_c7;
  array<char,_22UL> local_c6;
  string local_b0;
  undefined1 local_90 [8];
  query q;
  _Bind<void_(libtorrent::ssl_stream<libtorrent::http_stream>::*(libtorrent::ssl_stream<libtorrent::http_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>))(const_boost::system::error_code_&,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>)>
  *handler_local;
  endpoint_type *endpoint_local;
  http_stream *this_local;
  
  q.service_name_.field_2._8_8_ = handler;
  boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::operator=
            (&(this->super_proxy_base).m_remote_endpoint,endpoint);
  to_string(&local_c6,(long)(this->super_proxy_base).m_port);
  __s = std::array<char,_22UL>::data(&local_c6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,__s,&local_c7);
  boost::asio::ip::basic_resolver_query<boost::asio::ip::tcp>::basic_resolver_query
            ((basic_resolver_query<boost::asio::ip::tcp> *)local_90,
             &(this->super_proxy_base).m_hostname,&local_b0,address_configured);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_c7);
  local_120 = name_lookup;
  local_118 = 0;
  local_128 = this;
  std::function<void(boost::system::error_code_const&)>::
  function<std::_Bind<void(libtorrent::ssl_stream<libtorrent::http_stream>::*(libtorrent::ssl_stream<libtorrent::http_stream>*,std::_Placeholder<1>,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>))(boost::system::error_code_const&,std::shared_ptr<std::function<void(boost::system::error_code_const&)>>)>const,void>
            ((function<void(boost::system::error_code_const&)> *)&local_148,
             (_Bind<void_(libtorrent::ssl_stream<libtorrent::http_stream>::*(libtorrent::ssl_stream<libtorrent::http_stream>_*,_std::_Placeholder<1>,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>))(const_boost::system::error_code_&,_std::shared_ptr<std::function<void_(const_boost::system::error_code_&)>_>)>
              *)q.service_name_.field_2._8_8_);
  std::
  bind<void(libtorrent::http_stream::*)(boost::system::error_code_const&,boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,std::function<void(boost::system::error_code_const&)>&),libtorrent::http_stream*,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::function<void(boost::system::error_code_const&)>>
            (&local_110,(offset_in_http_stream_to_subr *)&local_120,&local_128,
             (_Placeholder<1> *)&std::placeholders::_1,(_Placeholder<2> *)&std::placeholders::_2,
             &local_148);
  boost::asio::ip::
  basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
  ::
  async_resolve<std::_Bind<void(libtorrent::http_stream::*(libtorrent::http_stream*,std::_Placeholder<1>,std::_Placeholder<2>,std::function<void(boost::system::error_code_const&)>))(boost::system::error_code_const&,boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,std::function<void(boost::system::error_code_const&)>&)>>
            ((basic_resolver<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
              *)&(this->super_proxy_base).m_resolver,(query *)local_90,&local_110);
  std::
  _Bind<void_(libtorrent::http_stream::*(libtorrent::http_stream_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::function<void_(const_boost::system::error_code_&)>))(const_boost::system::error_code_&,_boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>,_std::function<void_(const_boost::system::error_code_&)>_&)>
  ::~_Bind(&local_110);
  std::function<void_(const_boost::system::error_code_&)>::~function(&local_148);
  boost::asio::ip::basic_resolver_query<boost::asio::ip::tcp>::~basic_resolver_query
            ((basic_resolver_query<boost::asio::ip::tcp> *)local_90);
  return;
}

Assistant:

void async_connect(endpoint_type const& endpoint, Handler const& handler)
	{
		m_remote_endpoint = endpoint;

		// the connect is split up in the following steps:
		// 1. resolve name of proxy server
		// 2. connect to proxy server
		// 3. send HTTP CONNECT method and possibly username+password
		// 4. read CONNECT response

		using std::placeholders::_1;
		using std::placeholders::_2;
		tcp::resolver::query q(m_hostname, to_string(m_port).data());
		m_resolver.async_resolve(q, std::bind(
			&http_stream::name_lookup, this, _1, _2, handler_type(std::move(handler))));
	}